

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O1

void __thiscall OpenMD::SimInfo::calcNdfRaw(SimInfo *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int iVar6;
  
  p_Var2 = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->molecules_)._M_t._M_impl.super__Rb_tree_header;
  iVar6 = 0;
  if ((_Rb_tree_header *)p_Var2 == p_Var1) {
    p_Var4 = (_Base_ptr)0x0;
  }
  else {
    p_Var4 = p_Var2[1]._M_parent;
  }
  if (p_Var4 != (_Base_ptr)0x0) {
    iVar6 = 0;
    do {
      p_Var3 = *(_Base_ptr *)(p_Var4 + 5);
      if (p_Var3 == p_Var4[5]._M_parent) {
        p_Var5 = (_Base_ptr)0x0;
      }
      else {
        p_Var5 = *(_Base_ptr *)p_Var3;
      }
      while (p_Var5 != (_Base_ptr)0x0) {
        p_Var3 = (_Base_ptr)&p_Var3->_M_parent;
        if (*(int *)&p_Var5->_M_parent - 1U < 2) {
          if ((char)p_Var5[1]._M_color == _S_black) {
            iVar6 = iVar6 + 5;
          }
          else {
            iVar6 = iVar6 + 6;
          }
        }
        else {
          iVar6 = iVar6 + 3;
        }
        if (p_Var3 == p_Var4[5]._M_parent) {
          p_Var5 = (_Base_ptr)0x0;
        }
        else {
          p_Var5 = *(_Base_ptr *)p_Var3;
        }
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      if ((_Rb_tree_header *)p_Var2 == p_Var1) {
        p_Var4 = (_Base_ptr)0x0;
      }
      else {
        p_Var4 = p_Var2[1]._M_parent;
      }
    } while (p_Var4 != (_Base_ptr)0x0);
  }
  this->ndfRaw_ = iVar6;
  return;
}

Assistant:

void SimInfo::calcNdfRaw() {
    int ndfRaw_local;

    MoleculeIterator i;
    vector<StuntDouble*>::iterator j;
    Molecule* mol;
    StuntDouble* sd;

    // Raw degrees of freedom that we have to set
    ndfRaw_local = 0;

    for (mol = beginMolecule(i); mol != NULL; mol = nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        ndfRaw_local += 3;

        if (sd->isDirectional()) {
          if (sd->isLinear()) {
            ndfRaw_local += 2;
          } else {
            ndfRaw_local += 3;
          }
        }
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(&ndfRaw_local, &ndfRaw_, 1, MPI_INT, MPI_SUM, MPI_COMM_WORLD);
#else
    ndfRaw_                    = ndfRaw_local;
#endif
  }